

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_CLZ(DisasContext_conflict1 *s,arg_CLZ *a)

{
  ulong uVar1;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 ret;
  
  uVar1 = s->features;
  if ((short)uVar1 < 0) {
    tcg_ctx = s->uc->tcg_ctx;
    ret = load_reg(s,a->rm);
    tcg_gen_clzi_i32_aarch64(tcg_ctx,ret,ret,0x20);
    store_reg(s,a->rd,ret);
  }
  return SUB81((uVar1 & 0xffff) >> 0xf,0);
}

Assistant:

static bool trans_CLZ(DisasContext *s, arg_CLZ *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (!ENABLE_ARCH_5) {
        return false;
    }
    tmp = load_reg(s, a->rm);
    tcg_gen_clzi_i32(tcg_ctx, tmp, tmp, 32);
    store_reg(s, a->rd, tmp);
    return true;
}